

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<long,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  long *plVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = *(uint *)&this->num_components_;
  bVar2 = out_num_components;
  if ((byte)uVar6 < out_num_components) {
    bVar2 = (byte)uVar6;
  }
  bVar7 = bVar2 == 0;
  if (bVar7) {
LAB_00112c9d:
    if ((byte)uVar6 < out_num_components) {
      memset(out_value + (uVar6 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar6 & 0xff)) * 4 + 4);
    }
  }
  else {
    plVar3 = (long *)((this->buffer_->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                     this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    plVar1 = (long *)(this->buffer_->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (plVar3 < plVar1) {
      uVar4 = 1;
      do {
        iVar5 = (int)*plVar3;
        if ((long)iVar5 != *plVar3) {
          return bVar7;
        }
        out_value[uVar4 - 1] = iVar5;
        uVar6 = *(uint *)&this->num_components_;
        bVar2 = (byte)uVar6;
        if (out_num_components <= (byte)uVar6) {
          bVar2 = out_num_components;
        }
        bVar7 = bVar2 <= uVar4;
        if (bVar7) goto LAB_00112c9d;
        plVar3 = plVar3 + 1;
        uVar4 = uVar4 + 1;
      } while (plVar3 < plVar1);
    }
  }
  return bVar7;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }